

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads_kernel_2.h
# Opt level: O0

void __thiscall dlib::signaler::signaler(signaler *this,mutex *assoc_mutex)

{
  int iVar1;
  undefined8 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  undefined8 *in_RDI;
  string *a;
  error_type in_stack_ffffffffffffffbc;
  thread_error *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  *in_RDI = in_RSI;
  in_RDI[7] = in_RSI;
  iVar1 = pthread_cond_init((pthread_cond_t *)(in_RDI + 1),(pthread_condattr_t *)0x0);
  if (iVar1 != 0) {
    uVar2 = __cxa_allocate_exception(0x30);
    a = (string *)&stack0xffffffffffffffcf;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_RSI,in_stack_ffffffffffffffe8,(allocator<char> *)in_stack_ffffffffffffffe0);
    thread_error::thread_error(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,a);
    __cxa_throw(uVar2,&thread_error::typeinfo,thread_error::~thread_error);
  }
  return;
}

Assistant:

signaler (
            const mutex& assoc_mutex
        ) :
            associated_mutex(&assoc_mutex.myMutex),
            m(assoc_mutex)
        { 
            if (pthread_cond_init(&cond,0))
            {
                throw dlib::thread_error(ECREATE_SIGNALER,
        "in function signaler::signaler() an error occurred making the signaler"
                );      
            }
        }